

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseInfo *pTVar2;
  reference this_00;
  ostream *poVar3;
  ulong uVar4;
  Colour local_331;
  iterator iStack_330;
  Colour colourGuard;
  TestCase *prev;
  _Self local_310;
  _Self local_308;
  undefined4 local_2fc;
  string local_2f8 [32];
  TestCase local_2d8;
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_38 [8];
  string name;
  TestCase *testCase_local;
  TestRegistry *this_local;
  
  pTVar2 = TestCase::getTestCaseInfo(testCase);
  std::__cxx11::string::string(local_38,(string *)pTVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Anonymous test case ");
    uVar4 = this->m_unnamedCount + 1;
    this->m_unnamedCount = uVar4;
    std::ostream::operator<<(poVar3,uVar4);
    std::__cxx11::ostringstream::str();
    TestCase::withName(&local_2d8,testCase,local_2f8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_2d8);
    TestCase::~TestCase(&local_2d8);
    std::__cxx11::string::~string((string *)local_2f8);
    local_2fc = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  else {
    local_308._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         find(&this->m_functions,testCase);
    local_310._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         end(&this->m_functions);
    bVar1 = std::operator==(&local_308,&local_310);
    if (!bVar1) {
      iStack_330 = std::
                   set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                   ::find(&this->m_functions,testCase);
      this_00 = std::_Rb_tree_const_iterator<Catch::TestCase>::operator*(&stack0xfffffffffffffcd0);
      Colour::Colour(&local_331,Red);
      poVar3 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      poVar3 = std::operator<<(poVar3,local_38);
      poVar3 = std::operator<<(poVar3,"\" ) already defined.\n");
      poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
      pTVar2 = TestCase::getTestCaseInfo(this_00);
      poVar3 = Catch::operator<<(poVar3,&pTVar2->lineInfo);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tRedefined at ");
      pTVar2 = TestCase::getTestCaseInfo(testCase);
      poVar3 = Catch::operator<<(poVar3,&pTVar2->lineInfo);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Colour::~Colour(&local_331);
      exit(1);
    }
    std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::insert
              (&this->m_functions,testCase);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functionsInOrder,testCase);
    bVar1 = TestCaseInfo::isHidden(&testCase->super_TestCaseInfo);
    if (!bVar1) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (&this->m_nonHiddenFunctions,testCase);
    }
    local_2fc = 0;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                {
                    Colour colourGuard( Colour::Red );
                    std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                                << "\tFirst seen at " << prev.getTestCaseInfo().lineInfo << "\n"
                                << "\tRedefined at " << testCase.getTestCaseInfo().lineInfo << std::endl;
                }
                exit(1);
            }
        }